

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,Options *options)

{
  int iVar1;
  bool bVar2;
  ObjectiveCType OVar3;
  MapFieldGenerator *this;
  
  iVar1 = *(int *)(field + 0x3c);
  OVar3 = GetObjectiveCType(field);
  if (iVar1 == 3) {
    if (OVar3 == OBJECTIVECTYPE_ENUM) {
      this = (MapFieldGenerator *)operator_new(0x40);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,options);
    }
    else if (OVar3 == OBJECTIVECTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_map(field);
      if (bVar2) {
        this = (MapFieldGenerator *)operator_new(0x48);
        MapFieldGenerator::MapFieldGenerator(this,field,options);
      }
      else {
        this = (MapFieldGenerator *)operator_new(0x40);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,field,options);
      }
    }
    else {
      this = (MapFieldGenerator *)operator_new(0x40);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,options);
    }
  }
  else if (OVar3 == OBJECTIVECTYPE_ENUM) {
    this = (MapFieldGenerator *)operator_new(0x40);
    EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,options);
  }
  else if (OVar3 == OBJECTIVECTYPE_MESSAGE) {
    this = (MapFieldGenerator *)operator_new(0x40);
    MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,options);
  }
  else {
    bVar2 = IsReferenceType(field);
    this = (MapFieldGenerator *)operator_new(0x40);
    if (bVar2) {
      PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                ((PrimitiveObjFieldGenerator *)this,field,options);
    }
    else {
      PrimitiveFieldGenerator::PrimitiveFieldGenerator
                ((PrimitiveFieldGenerator *)this,field,options);
    }
  }
  (*(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
    super_FieldGenerator._vptr_FieldGenerator[0xb])(this);
  return (FieldGenerator *)this;
}

Assistant:

FieldGenerator* FieldGenerator::Make(const FieldDescriptor* field,
                                     const Options& options) {
  FieldGenerator* result = NULL;
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          result = new MapFieldGenerator(field, options);
        } else {
          result = new RepeatedMessageFieldGenerator(field, options);
        }
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new RepeatedEnumFieldGenerator(field, options);
        break;
      default:
        result = new RepeatedPrimitiveFieldGenerator(field, options);
        break;
    }
  } else {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        result = new MessageFieldGenerator(field, options);
        break;
      }
      case OBJECTIVECTYPE_ENUM:
        result = new EnumFieldGenerator(field, options);
        break;
      default:
        if (IsReferenceType(field)) {
          result = new PrimitiveObjFieldGenerator(field, options);
        } else {
          result = new PrimitiveFieldGenerator(field, options);
        }
        break;
    }
  }
  result->FinishInitialization();
  return result;
}